

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool art_node_iterator_lower_bound(art_ref_t ref,art_iterator_t *iterator,art_key_chunk_t *key)

{
  long lVar1;
  undefined4 *puVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  _Bool _Var6;
  int iVar7;
  size_t i;
  byte *pbVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  art_ref_t aVar15;
  art_typecode_t typecode;
  long lVar16;
  _Bool local_41;
  undefined1 local_40;
  
  do {
    iVar7 = (int)(ref & 0xff);
    if ((ref & 0xff) == 1) {
      uVar9 = (ulong)(uint)(iVar7 << 3);
      lVar1 = *(long *)((long)iterator->art->nodes + uVar9);
      lVar13 = (ref >> 0x10) * *(long *)((long)ART_NODE_SIZES + uVar9);
      puVar2 = (undefined4 *)(lVar1 + lVar13);
      uVar10 = *(uint *)(lVar1 + lVar13);
      uVar14 = *(uint *)key;
      uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
      uVar14 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
      if (uVar10 == uVar14) {
        uVar10 = (uint)(ushort)(*(ushort *)(puVar2 + 1) << 8 | *(ushort *)(puVar2 + 1) >> 8);
        uVar14 = (uint)(ushort)(*(ushort *)(key + 4) << 8 | *(ushort *)(key + 4) >> 8);
        uVar12 = 0;
        if (uVar10 != uVar14) goto LAB_00104b7c;
      }
      else {
LAB_00104b7c:
        uVar12 = -(uint)(uVar10 < uVar14) | 1;
      }
      if ((int)uVar12 < 0) {
        _Var6 = art_iterator_up_and_move(iterator,true);
        return _Var6;
      }
      bVar3 = iterator->frame;
      iterator->frames[bVar3].ref = ref;
      iterator->frames[bVar3].index_in_node = '\0';
      *(undefined2 *)(iterator->key + 4) = *(undefined2 *)(puVar2 + 1);
      *(undefined4 *)iterator->key = *puVar2;
      iterator->value = (art_val_t *)(puVar2 + 2);
      local_41 = true;
      break;
    }
    uVar9 = (ulong)(uint)(iVar7 << 3);
    lVar13 = *(long *)((long)iterator->art->nodes + uVar9);
    lVar16 = (ref >> 0x10) * *(long *)((long)ART_NODE_SIZES + uVar9);
    lVar1 = lVar16 + lVar13;
    bVar3 = iterator->depth;
    uVar9 = (ulong)*(byte *)(lVar16 + lVar13);
    iVar7 = memcmp((byte *)(lVar16 + lVar13) + 1,key + bVar3,uVar9);
    aVar15 = ref;
    if (iVar7 < 0) {
      local_41 = art_iterator_up_and_move(iterator,true);
      bVar5 = false;
    }
    else {
      if (iVar7 == 0) {
        bVar3 = (key + bVar3)[uVar9];
        uVar9 = (ulong)bVar3;
        local_40 = (undefined1)ref;
        switch(local_40) {
        case 2:
          if ((ulong)*(byte *)(lVar1 + 6) != 0) {
            uVar9 = 0;
            do {
              bVar4 = *(byte *)(lVar1 + 7 + uVar9);
              if (bVar3 <= bVar4) {
                aVar15 = *(art_ref_t *)(lVar1 + 0x10 + uVar9 * 8);
LAB_00104ada:
                uVar11 = (ulong)bVar4;
                goto LAB_00104add;
              }
              uVar9 = uVar9 + 1;
            } while (*(byte *)(lVar1 + 6) != uVar9);
          }
          break;
        case 3:
          if ((ulong)*(byte *)(lVar1 + 6) != 0) {
            uVar9 = 0;
            do {
              bVar4 = *(byte *)(lVar1 + 7 + uVar9);
              if (bVar3 <= bVar4) {
                aVar15 = *(art_ref_t *)(lVar1 + 0x18 + uVar9 * 8);
                goto LAB_00104ada;
              }
              uVar9 = uVar9 + 1;
            } while (*(byte *)(lVar1 + 6) != uVar9);
          }
          break;
        case 4:
          uVar11 = (ulong)CONCAT11(bVar3,bVar3);
          pbVar8 = (byte *)(lVar16 + uVar9 + lVar13 + 0x10);
          do {
            if ((ulong)*pbVar8 != 0x30) {
              aVar15 = *(art_ref_t *)(lVar1 + 0x110 + (ulong)*pbVar8 * 8);
              goto LAB_00104ae0;
            }
            uVar11 = uVar11 + 0x101;
            pbVar8 = pbVar8 + 1;
          } while (uVar11 != 0x10100);
          break;
        case 5:
          do {
            aVar15 = *(art_ref_t *)(lVar1 + 8 + uVar9 * 8);
            uVar11 = uVar9;
            if (aVar15 != 0) goto LAB_00104add;
            uVar9 = uVar9 + 1;
          } while (uVar9 != 0x100);
          aVar15 = 0;
          uVar9 = 0;
          uVar11 = uVar9;
LAB_00104add:
          uVar11 = uVar11 * 0x100 + uVar9;
          goto LAB_00104ae0;
        }
        aVar15 = 0;
        uVar11 = 0;
LAB_00104ae0:
        if (aVar15 != 0) {
          art_iterator_down(iterator,ref,(uint8_t)uVar11);
          bVar5 = true;
          if (((uint)(uVar11 >> 8) & 0xff) <= (uint)bVar3) goto LAB_001049e5;
          goto LAB_001049d1;
        }
        local_41 = art_iterator_up_and_move(iterator,true);
      }
      else {
LAB_001049d1:
        art_node_init_iterator(aVar15,iterator,true);
        local_41 = true;
      }
      bVar5 = false;
      aVar15 = ref;
    }
LAB_001049e5:
    ref = aVar15;
  } while (bVar5);
  return (_Bool)(local_41 & 1);
}

Assistant:

static bool art_node_iterator_lower_bound(art_ref_t ref,
                                          art_iterator_t *iterator,
                                          const art_key_chunk_t key[]) {
    while (!art_is_leaf(ref)) {
        art_inner_node_t *inner_node =
            (art_inner_node_t *)art_deref(iterator->art, ref);
        int prefix_comparison =
            art_compare_prefix(inner_node->prefix, 0, key, iterator->depth,
                               inner_node->prefix_size);
        if (prefix_comparison < 0) {
            // Prefix so far has been equal, but we've found a smaller key.
            // Since we take the lower bound within each node, we can return
            // the next leaf.
            return art_iterator_up_and_move(iterator, true);
        } else if (prefix_comparison > 0) {
            // No key equal to the key we're looking for, return the first
            // leaf.
            return art_node_init_iterator(ref, iterator, true);
        }
        // Prefix is equal, move to lower bound child.
        art_key_chunk_t key_chunk =
            key[iterator->depth + inner_node->prefix_size];
        art_indexed_child_t indexed_child = art_node_lower_bound(
            (art_node_t *)inner_node, art_ref_typecode(ref), key_chunk);
        if (indexed_child.child == CROARING_ART_NULL_REF) {
            // Only smaller keys among children.
            return art_iterator_up_and_move(iterator, true);
        }
        if (indexed_child.key_chunk > key_chunk) {
            // Only larger children, return the first larger child.
            art_iterator_down(iterator, ref, indexed_child.index);
            return art_node_init_iterator(indexed_child.child, iterator, true);
        }
        // We found a child with an equal prefix.
        art_iterator_down(iterator, ref, indexed_child.index);
        ref = indexed_child.child;
    }
    art_leaf_t *leaf = (art_leaf_t *)art_deref(iterator->art, ref);
    if (art_compare_keys(leaf->key, key) >= 0) {
        // Leaf has an equal or larger key.
        return art_iterator_valid_loc(iterator, ref);
    }
    // Leaf has an equal prefix, but the full key is smaller. Move to the
    // next leaf.
    return art_iterator_up_and_move(iterator, true);
}